

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiContextTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_0::MultiContextTest::iterate(MultiContextTest *this)

{
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  GLenum err;
  Library *egl;
  EGLDisplay pvVar4;
  EGLConfig pvVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar6;
  void *pvVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long lVar9;
  MultiContextTest *pMVar10;
  char *pcVar11;
  _Alloc_hider _Var12;
  ulong uVar13;
  bool bVar14;
  vector<void_*,_std::allocator<void_*>_> contexts;
  UniqueDisplay display;
  EGLContext context;
  EGLint attribList [3];
  UniqueSurface surface;
  EGLint pbufferAttribList [5];
  ResultCollector resultCollector;
  Random rng;
  Functions gl;
  vector<void_*,_std::allocator<void_*>_> local_1cf8;
  MultiContextTest *local_1cd8;
  UniqueDisplay local_1cd0;
  void *local_1cc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1cb8;
  undefined8 local_1cb0;
  undefined4 local_1ca8;
  string local_1ca0;
  UniqueSurface local_1c80;
  undefined4 local_1c68;
  undefined4 uStack_1c64;
  undefined4 uStack_1c60;
  undefined4 uStack_1c5c;
  undefined4 local_1c58;
  ResultCollector local_1c48;
  undefined1 local_1bf8 [8];
  _func_int **local_1bf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1be8 [6];
  ios_base local_1b80 [264];
  deRandom local_1a78;
  code *local_1a68;
  int local_1a60;
  undefined1 local_1a58 [392];
  glClearFunc local_18d0;
  glClearColorFunc local_1898;
  glFinishFunc local_1410;
  glGetErrorFunc local_1258;
  EGLSurface surface_00;
  
  dVar2 = 0x86aa46;
  if (this->m_sharing == SHARING_SHARED) {
    dVar2 = 0x94ecb894;
  }
  local_1ca8 = 0x3038;
  local_1cb0 = 0x200003098;
  local_1c68 = 0x3057;
  uStack_1c64 = 0x40;
  uStack_1c60 = 0x3056;
  uStack_1c5c = 0x40;
  local_1c58 = 0x3038;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a58._0_8_ = local_1a58 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a58,0x1af8059);
  tcu::ResultCollector::ResultCollector
            (&local_1c48,(TestLog *)&paVar8->_M_allocated_capacity,(string *)local_1a58);
  if ((undefined1 *)local_1a58._0_8_ != local_1a58 + 0x10) {
    operator_delete((void *)local_1a58._0_8_,local_1a58._16_8_ + 1);
  }
  deRandom_init(&local_1a78,dVar2);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar4 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  eglu::UniqueDisplay::UniqueDisplay(&local_1cd0,egl,pvVar4);
  pvVar4 = local_1cd0.m_display;
  local_1a58._0_8_ = (pointer)0x0;
  local_1a58._8_8_ = (pointer)0x0;
  local_1a58._16_8_ = 0;
  eglu::FilterList::operator<<((FilterList *)local_1a58,isES2Renderable);
  pvVar5 = eglu::chooseSingleConfig(egl,pvVar4,(FilterList *)local_1a58);
  if ((pointer)local_1a58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a58._0_8_,local_1a58._16_8_ - local_1a58._0_8_);
  }
  pvVar4 = local_1cd0.m_display;
  if (this->m_use == USE_NONE) {
    surface_00 = (EGLSurface)0x0;
  }
  else {
    iVar1 = (*egl->_vptr_Library[10])(egl,local_1cd0.m_display,pvVar5,&local_1c68);
    surface_00 = (EGLSurface)CONCAT44(extraout_var,iVar1);
  }
  eglu::UniqueSurface::UniqueSurface(&local_1c80,egl,pvVar4,surface_00);
  dVar2 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar2,"Failed to create pbuffer.",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                   ,0x7f);
  local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (void **)0x0;
  local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (void **)0x0;
  local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (void **)0x0;
  glw::Functions::Functions((Functions *)local_1a58);
  std::vector<void_*,_std::allocator<void_*>_>::reserve(&local_1cf8,0x80);
  local_1bf8 = (undefined1  [8])paVar8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1bf0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1bf0,"Trying to create ",0x11);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1bf0);
  bVar14 = this->m_sharing == SHARING_SHARED;
  pcVar11 = " ";
  if (bVar14) {
    pcVar11 = " shared ";
  }
  lVar9 = 1;
  if (bVar14) {
    lVar9 = 8;
  }
  local_1cd8 = this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1bf0,pcVar11,lVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1bf0,"contexts.",9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1bf8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1bf0);
  std::ios_base::~ios_base(local_1b80);
  local_1bf8 = (undefined1  [8])paVar8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1bf0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1bf0,"Requiring that at least ",0x18);
  pMVar10 = local_1cd8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1bf0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1bf0," contexts can be created.",0x19);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1bf8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1bf0);
  std::ios_base::~ios_base(local_1b80);
  if (pMVar10->m_use == USE_CLEAR) {
    EglTestContext::initGLFunctions
              ((pMVar10->super_TestCase).m_eglTestCtx,(Functions *)local_1a58,(ApiType)0x2);
  }
  (**egl->_vptr_Library)(egl,0x30a0);
  dVar2 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar2,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                   ,0x8c);
  uVar13 = 0;
  local_1cb8 = paVar8;
  do {
    if (uVar13 == 0) {
      pvVar7 = (void *)0x0;
    }
    else {
      pvVar7 = (void *)0x0;
      if (pMVar10->m_sharing == SHARING_SHARED) {
        dVar2 = deRandom_getUint32(&local_1a78);
        pvVar7 = local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[(ulong)dVar2 % (uVar13 & 0xffffffff)];
      }
    }
    iVar1 = (*egl->_vptr_Library[6])(egl,local_1cd0.m_display,pvVar5,pvVar7,&local_1cb0);
    local_1cc0 = (void *)CONCAT44(extraout_var_00,iVar1);
    iVar1 = (*egl->_vptr_Library[0x1f])(egl);
    if ((iVar1 != 0x3000) || (local_1cc0 == (void *)0x0)) {
      local_1bf8 = (undefined1  [8])local_1cb8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1bf0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1bf0,"Got error after creating ",0x19);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1bf0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1bf0," contexts.",10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bf8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1bf0);
      std::ios_base::~ios_base(local_1b80);
      if (iVar1 == 0x3003) {
        if (uVar13 < 0x20) {
          local_1bf8 = (undefined1  [8])local_1be8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1bf8,
                     "Couldn\'t create the minimum number of contexts required.","");
          tcu::ResultCollector::fail(&local_1c48,(string *)local_1bf8);
          local_1ca0.field_2._M_allocated_capacity = local_1be8[0]._M_allocated_capacity;
          _Var12._M_p = (pointer)local_1bf8;
          if (local_1bf8 != (undefined1  [8])local_1be8) goto LAB_00e3fc01;
        }
        else {
          local_1bf8 = (undefined1  [8])local_1cb8;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1bf0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1bf0,"Got EGL_BAD_ALLOC.",0x12);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1bf8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1bf0);
          std::ios_base::~ios_base(local_1b80);
        }
      }
      else {
        local_1a68 = eglu::getErrorName;
        local_1a60 = iVar1;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1ca0,&local_1a68);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1ca0,0,(char *)0x0,0x1b9dcae);
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 == paVar8) {
          local_1be8[0]._0_8_ = paVar8->_M_allocated_capacity;
          local_1be8[0]._8_8_ = puVar6[3];
          local_1bf8 = (undefined1  [8])local_1be8;
        }
        else {
          local_1be8[0]._0_8_ = paVar8->_M_allocated_capacity;
          local_1bf8 = (undefined1  [8])*puVar6;
        }
        local_1bf0 = (_func_int **)puVar6[1];
        *puVar6 = paVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        tcu::ResultCollector::fail(&local_1c48,(string *)local_1bf8);
        if (local_1bf8 != (undefined1  [8])local_1be8) {
          operator_delete((void *)local_1bf8,(ulong)(local_1be8[0]._M_allocated_capacity + 1));
        }
        _Var12._M_p = local_1ca0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1ca0._M_dataplus._M_p != &local_1ca0.field_2) {
LAB_00e3fc01:
          operator_delete(_Var12._M_p,
                          (ulong)((long)&((qpTestLog *)local_1ca0.field_2._M_allocated_capacity)->
                                         flags + 1));
        }
      }
      if (local_1cc0 != (void *)0x0) {
        local_1bf8 = (undefined1  [8])local_1be8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1bf8,
                   "eglCreateContext() produced error, but context is not EGL_NO_CONTEXT","");
        tcu::ResultCollector::fail(&local_1c48,(string *)local_1bf8);
LAB_00e3fc4d:
        if (local_1bf8 != (undefined1  [8])local_1be8) {
          operator_delete((void *)local_1bf8,(ulong)(local_1be8[0]._M_allocated_capacity + 1));
        }
      }
      break;
    }
    if (local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                ((vector<void*,std::allocator<void*>> *)&local_1cf8,
                 (iterator)
                 local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_1cc0);
    }
    else {
      *local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_finish = local_1cc0;
      local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
    }
    if (pMVar10->m_use - USE_MAKECURRENT < 2) {
      iVar1 = (*egl->_vptr_Library[0x27])
                        (egl,local_1cd0.m_display,local_1c80.m_surface,local_1c80.m_surface,
                         local_1cc0);
      iVar3 = (*egl->_vptr_Library[0x1f])(egl);
      if ((iVar1 == 0) || (iVar3 != 0x3000)) {
        local_1bf8 = (undefined1  [8])local_1cb8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1bf0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1bf0,"Failed to make ",0xf);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1bf0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1bf0,"th context current: ",0x14);
        local_1ca0._M_dataplus._M_p = (pointer)eglu::getErrorName;
        local_1ca0._M_string_length._0_4_ = iVar3;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1ca0,(ostream *)&local_1bf0);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1bf8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1bf0);
        std::ios_base::~ios_base(local_1b80);
        local_1bf8 = (undefined1  [8])local_1be8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1bf8,"Failed to make context current","");
        tcu::ResultCollector::fail(&local_1c48,(string *)local_1bf8);
        goto LAB_00e3fc4d;
      }
      if (local_1cd8->m_use == USE_CLEAR) {
        (*local_1898)(0.25,0.75,0.5,1.0);
        (*local_18d0)(0x4000);
        (*local_1410)();
        err = (*local_1258)();
        glu::checkError(err,"Failed to clear color.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                        ,0xbe);
      }
    }
    uVar13 = uVar13 + 1;
    pMVar10 = local_1cd8;
  } while (uVar13 != 0x80);
  if (local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar13 = 0;
    do {
      (*egl->_vptr_Library[0x13])
                (egl,local_1cd0.m_display,
                 local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13]);
      dVar2 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar2,"destroyContext(*display, contexts[contextNdx])",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                       ,0xc6);
      local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar13] = (void *)0x0;
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pMVar10 = local_1cd8;
  if (local_1cd8->m_use - USE_MAKECURRENT < 2) {
    (*egl->_vptr_Library[0x27])(egl,local_1cd0.m_display,0,0,0);
    dVar2 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar2,"makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                     ,0xcb);
  }
  tcu::ResultCollector::setTestContextResult
            (&local_1c48,(pMVar10->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if (local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (void **)0x0) {
    operator_delete(local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  eglu::UniqueSurface::~UniqueSurface(&local_1c80);
  eglu::UniqueDisplay::~UniqueDisplay(&local_1cd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c48.m_message._M_dataplus._M_p != &local_1c48.m_message.field_2) {
    operator_delete(local_1c48.m_message._M_dataplus._M_p,
                    local_1c48.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c48.m_prefix._M_dataplus._M_p != &local_1c48.m_prefix.field_2) {
    operator_delete(local_1c48.m_prefix._M_dataplus._M_p,
                    local_1c48.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult MultiContextTest::iterate (void)
{
	const deUint32					seed			= m_sharing == SHARING_SHARED ? 2498541716u : 8825414;
	const size_t					maxContextCount	= 128;
	const size_t					minContextCount	= 32;
	const eglw::EGLint				attribList[]	=
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};
	const eglw::EGLint				pbufferAttribList[]	=
	{
		EGL_WIDTH,	64,
		EGL_HEIGHT,	64,
		EGL_NONE
	};

	TestLog&						log				= m_testCtx.getLog();
	tcu::ResultCollector			resultCollector	(log);
	de::Random						rng				(seed);

	const eglw::Library&			egl				= m_eglTestCtx.getLibrary();
	const eglu::UniqueDisplay		display			(egl, eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay()));
	const eglw::EGLConfig			config			= getConfig(egl, *display);

	const eglu::UniqueSurface		surface			(egl, *display, m_use != USE_NONE ? egl.createPbufferSurface(*display, config, pbufferAttribList) : EGL_NO_SURFACE);
	EGLU_CHECK_MSG(egl, "Failed to create pbuffer.");

	std::vector<eglw::EGLContext>	contexts;
	glw::Functions					gl;

	contexts.reserve(maxContextCount);

	log << TestLog::Message << "Trying to create " << maxContextCount << (m_sharing == SHARING_SHARED ? " shared " : " ") << "contexts." << TestLog::EndMessage;
	log << TestLog::Message << "Requiring that at least " << minContextCount << " contexts can be created." << TestLog::EndMessage;

	if (m_use == USE_CLEAR)
		m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));

	EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));

	try
	{
		for (size_t contextCount = 0; contextCount < maxContextCount; contextCount++)
		{
			const eglw::EGLContext	sharedContext	= (m_sharing == SHARING_SHARED && contextCount > 0 ? contexts[rng.getUint32() % (deUint32)contextCount] : EGL_NO_CONTEXT);
			const eglw::EGLContext	context			= egl.createContext(*display, config, sharedContext, attribList);
			const eglw::EGLint		error			= egl.getError();

			if (context == EGL_NO_CONTEXT || error != EGL_SUCCESS)
			{
				log << TestLog::Message << "Got error after creating " << contextCount << " contexts." << TestLog::EndMessage;

				if (error == EGL_BAD_ALLOC)
				{
					if (contextCount < minContextCount)
						resultCollector.fail("Couldn't create the minimum number of contexts required.");
					else
						log << TestLog::Message << "Got EGL_BAD_ALLOC." << TestLog::EndMessage;
				}
				else
					resultCollector.fail("eglCreateContext() produced error that is not EGL_BAD_ALLOC: " + eglu::getErrorStr(error).toString());

				if (context != EGL_NO_CONTEXT)
					resultCollector.fail("eglCreateContext() produced error, but context is not EGL_NO_CONTEXT");

				break;
			}
			else
			{
				contexts.push_back(context);

				if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
				{
					const eglw::EGLBoolean	result				= egl.makeCurrent(*display, *surface, *surface, context);
					const eglw::EGLint		makeCurrentError	= egl.getError();

					if (!result || makeCurrentError != EGL_SUCCESS)
					{
						log << TestLog::Message << "Failed to make " << (contextCount + 1) << "th context current: " << eglu::getErrorStr(makeCurrentError) << TestLog::EndMessage;
						resultCollector.fail("Failed to make context current");

						break;
					}
					else if (m_use == USE_CLEAR)
					{
						gl.clearColor(0.25f, 0.75f, 0.50f, 1.00f);
						gl.clear(GL_COLOR_BUFFER_BIT);
						gl.finish();
						GLU_CHECK_GLW_MSG(gl, "Failed to clear color.");
					}
				}
			}
		}

		for (size_t contextNdx = 0; contextNdx < contexts.size(); contextNdx++)
		{
			EGLU_CHECK_CALL(egl, destroyContext(*display, contexts[contextNdx]));
			contexts[contextNdx] = EGL_NO_CONTEXT;
		}

		if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
			EGLU_CHECK_CALL(egl, makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}
	catch (...)
	{
		for (size_t contextNdx = 0; contextNdx < contexts.size(); contextNdx++)
		{
			if (contexts[contextNdx] != EGL_NO_CONTEXT)
				EGLU_CHECK_CALL(egl, destroyContext(*display, contexts[contextNdx]));
		}

		if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
			EGLU_CHECK_CALL(egl, makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

		throw;
	}

	resultCollector.setTestContextResult(m_testCtx);
	return STOP;
}